

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O2

int SetDeviceCurrentState(char *szFilename,int bON)

{
  int iVar1;
  FILE *__stream;
  char *__s;
  
  __stream = fopen(szFilename,"w");
  if (__stream == (FILE *)0x0) {
    __s = "Unable to create device current state file.";
  }
  else {
    iVar1 = fprintf(__stream,"%d",bON);
    if (iVar1 < 1) {
      puts("Error writing device current state file.");
      fclose(__stream);
      return 1;
    }
    iVar1 = fclose(__stream);
    if (iVar1 == 0) {
      return 0;
    }
    __s = "Error closing device current state file.";
  }
  puts(__s);
  return 1;
}

Assistant:

int SetDeviceCurrentState(char* szFilename, int bON)
{

	// Should use an interprocess semaphore...

	FILE* file = NULL;

	file = fopen(szFilename, "w");
	if (file == NULL)
	{
		printf("Unable to create device current state file.\n");
		return EXIT_FAILURE;
	}
	if (fprintf(file, "%d", bON) <= 0)
	{
		printf("Error writing device current state file.\n");
		fclose(file);
		return EXIT_FAILURE;
	}
	if (fclose(file) != EXIT_SUCCESS)
	{
		printf("Error closing device current state file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}